

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall mjs::parser::parse_primary_expression(parser *this)

{
  uint uVar1;
  ulong uVar2;
  token_type tVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  _Alloc_hider _Var8;
  undefined4 uVar9;
  ulong uVar10;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  _Var11;
  wostream *pwVar12;
  char *in_RCX;
  long lVar13;
  wchar_t *pwVar14;
  ulong uVar15;
  expression *extraout_RDX;
  expression *extraout_RDX_00;
  expression *extraout_RDX_01;
  expression *e;
  wstring_view *s;
  int __fd;
  parser *in_RSI;
  token *this_00;
  wchar_t *in_R9;
  property_name_and_value *ppVar16;
  bool bVar17;
  wstring_view wVar18;
  wstring new_item_str;
  property_name_and_value_list elements;
  pointer *__ptr;
  token id;
  wostringstream _oss;
  undefined1 local_2b8 [40];
  _Alloc_hider _Stack_290;
  size_type local_288;
  undefined1 local_280 [16];
  source_extend *local_270;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_268;
  undefined1 local_258 [40];
  undefined1 local_230 [376];
  pointer local_b8;
  pointer local_b0;
  token local_a8;
  token local_80;
  token local_58;
  
  __fd = (int)in_RSI;
  accept((parser *)local_258,__fd,(sockaddr *)0x2,(socklen_t *)in_RCX);
  if ((local_258._0_4_ == identifier) || (local_258._0_4_ == string_literal)) {
    make_expression<mjs::identifier_expression,std::__cxx11::wstring_const&>
              (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    in_RSI);
  }
  else {
    if (local_258._0_4_ != eof) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    accept((parser *)local_230,__fd,(sockaddr *)0x65,(socklen_t *)in_RCX);
    uVar9 = local_230._0_4_;
    token::destroy((token *)local_230);
    if (uVar9 == 0x72) {
      local_280._0_8_ = this;
      if (0 < (int)in_RSI->version_) {
        accept((parser *)local_230,__fd,(sockaddr *)0x32,(socklen_t *)in_RCX);
        uVar9 = local_230._0_4_;
        token::destroy((token *)local_230);
        if (uVar9 != 0x72) {
          local_2b8._0_8_ = (pointer)0x0;
          local_2b8._8_8_ = (pointer)0x0;
          local_2b8._16_8_ = (pointer)0x0;
          bVar5 = false;
LAB_0017ce6a:
          accept((parser *)local_230,__fd,(sockaddr *)0x33,(socklen_t *)in_RCX);
          uVar9 = local_230._0_4_;
          token::destroy((token *)local_230);
          if (uVar9 == 0x72) {
            accept((parser *)local_230,__fd,(sockaddr *)0x20,(socklen_t *)in_RCX);
            uVar9 = local_230._0_4_;
            token::destroy((token *)local_230);
            bVar17 = uVar9 == 0x72;
            if (!bVar17) goto LAB_0017cf09;
            if (bVar5) {
              in_RCX = "parse_primary_expression";
              expect(&local_58,in_RSI,comma,"parse_primary_expression",0x1da);
              token::destroy(&local_58);
            }
            parse_assignment_expression((parser *)local_230);
            std::
            vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
            ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                      ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                        *)local_2b8,
                       (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                       local_230);
            goto LAB_0017cf2d;
          }
          make_expression<mjs::array_literal_expression,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                    (this,(vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                           *)in_RSI);
          std::
          vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
          ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                     *)local_2b8);
          goto LAB_0017cd8d;
        }
        if (0 < (int)in_RSI->version_) {
          accept((parser *)local_230,__fd,(sockaddr *)0x30,(socklen_t *)in_RCX);
          uVar9 = local_230._0_4_;
          token::destroy((token *)local_230);
          if (uVar9 != 0x72) {
            local_2b8._32_8_ = 0;
            _Stack_290._M_p = (pointer)0x0;
            local_288 = 0;
            while( true ) {
              accept((parser *)local_230,__fd,(sockaddr *)0x31,(socklen_t *)in_RCX);
              uVar9 = local_230._0_4_;
              token::destroy((token *)local_230);
              if (uVar9 != 0x72) break;
              if ((pointer)local_2b8._32_8_ != _Stack_290._M_p) {
                in_RCX = "parse_primary_expression";
                expect(&local_80,in_RSI,comma,"parse_primary_expression",0x1e6);
                token::destroy(&local_80);
                if (1 < (int)in_RSI->version_) {
                  accept((parser *)local_230,__fd,(sockaddr *)0x31,(socklen_t *)in_RCX);
                  uVar9 = local_230._0_4_;
                  token::destroy((token *)local_230);
                  if (uVar9 != 0x72) break;
                }
              }
              parse_property_name_and_value((property_name_and_value *)local_230,in_RSI);
              std::
              vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
              emplace_back<mjs::property_name_and_value>
                        ((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                          *)(local_2b8 + 0x20),(property_name_and_value *)local_230);
              e = extraout_RDX;
              if ((parser *)local_230._16_8_ != (parser *)0x0) {
                (**(code **)(*(long *)local_230._16_8_ + 8))();
                e = extraout_RDX_00;
              }
              local_230._16_8_ = (parser *)0x0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (**(code **)(*(long *)local_230._8_8_ + 8))();
                e = extraout_RDX_01;
              }
              _Var8._M_p = _Stack_290._M_p;
              if (1 < (int)in_RSI->version_) {
                property_name_string_abi_cxx11_
                          ((wstring *)local_2b8,*(mjs **)(_Stack_290._M_p + -4),e);
                local_230._8_8_ = _Var8._M_p + -6;
                ppVar16 = (property_name_and_value *)(_Stack_290._M_p + -6);
                local_230._0_8_ = (element_type *)local_2b8;
                local_230._16_8_ = in_RSI;
                _Var11 = std::
                         __find_if<__gnu_cxx::__normal_iterator<mjs::property_name_and_value*,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>,__gnu_cxx::__ops::_Iter_pred<mjs::parser::parse_primary_expression()::_lambda(mjs::property_name_and_value_const&)_1_>>
                                   (local_2b8._32_8_,ppVar16);
                this = (parser *)local_280._0_8_;
                if (_Var11._M_current != ppVar16) {
                  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
                  pwVar12 = std::operator<<((wostream *)local_230,
                                            "Invalid redefinition of property: \"");
                  local_b8 = (pointer)local_2b8._8_8_;
                  local_b0 = (pointer)local_2b8._0_8_;
                  cpp_quote_abi_cxx11_((wstring *)(local_280 + 8),(mjs *)&local_b8,s);
                  pwVar12 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                      (pwVar12,(wchar_t *)local_280._8_8_,(long)local_270);
                  std::operator<<(pwVar12,"\"");
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_280._8_8_ != &local_268) {
                    operator_delete((void *)local_280._8_8_,local_268._M_allocated_capacity * 4 + 4)
                    ;
                  }
                  uVar4 = *(undefined8 *)(_Stack_290._M_p + -4);
                  std::__cxx11::wstringbuf::str();
                  wVar18._M_str = in_R9;
                  wVar18._M_len = local_280._8_8_;
                  syntax_error((parser *)"parse_primary_expression",(char *)0x207,(int)uVar4 + 8,
                               local_270,wVar18);
                }
                if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
                  operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ * 4 + 4);
                }
              }
            }
            make_expression<mjs::object_literal_expression,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>
                      (this,(vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                             *)in_RSI);
            std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ::~vector((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                       *)(local_2b8 + 0x20));
            goto LAB_0017cd8d;
          }
          if ((0 < (int)in_RSI->version_) &&
             ((tVar3 = (in_RSI->current_token_).type_, tVar3 == divide || (tVar3 == divideequal))))
          {
            wVar18 = lexer::get_regex_literal(&in_RSI->lexer_);
            pwVar14 = wVar18._M_str;
            uVar10 = wVar18._M_len;
            check_token(in_RSI);
            skip_whitespace(in_RSI);
            if (uVar10 < 3) {
              __assert_fail("lit.size() >= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x211,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            if (*pwVar14 != L'/') {
              __assert_fail("lit[0] == \'/\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x212,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            lVar13 = -4;
            uVar15 = 0;
            do {
              if (uVar10 + uVar15 == 0) goto LAB_0017d191;
              uVar2 = uVar15 - 1;
              lVar13 = lVar13 + 4;
              lVar7 = uVar15 - 1;
              uVar15 = uVar2;
            } while (pwVar14[uVar10 + lVar7] != L'/');
            if (uVar10 + uVar2 + 1 < 3) {
LAB_0017d191:
              __assert_fail("lit_end > 1 && lit_end != std::wstring_view::npos",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x214,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            local_230._0_8_ = uVar10 + uVar2 + -1;
            local_230._8_8_ = pwVar14 + 1;
            local_2b8._0_8_ = ~uVar2;
            local_2b8._8_8_ = (long)pwVar14 + (uVar10 * 4 - lVar13);
            make_expression<mjs::regexp_literal_expression,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      (this,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)in_RSI,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_230);
            goto LAB_0017cd8d;
          }
        }
      }
      accept((parser *)local_230,__fd,(sockaddr *)0x2e,(socklen_t *)in_RCX);
      uVar9 = local_230._0_4_;
      token::destroy((token *)local_230);
      if (uVar9 == 0x72) {
        tVar3 = (in_RSI->current_token_).type_;
        uVar1 = tVar3 - false_;
        if (((0x21 < uVar1) || ((0x200040001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
           (1 < tVar3 - numeric_literal)) {
          token::destroy((token *)local_258);
          unhandled(in_RSI,"parse_primary_expression",0x21e);
        }
        check_literal(in_RSI);
        get_token((token *)local_230,in_RSI);
        make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
        this_00 = (token *)local_230;
      }
      else {
        parse_expression(this);
        expect(&local_a8,in_RSI,rparen,"parse_primary_expression",0x218);
        this_00 = &local_a8;
      }
      token::destroy(this_00);
    }
    else {
      make_expression<mjs::this_expression>(this);
    }
  }
LAB_0017cd8d:
  token::destroy((token *)local_258);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (tuple<mjs::expression_*,_std::default_delete<mjs::expression>_>)this;
LAB_0017cf09:
  bVar6 = !bVar5;
  bVar5 = bVar17;
  if (bVar6) {
    local_230._0_8_ = (element_type *)0x0;
    std::
    vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
    ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                *)local_2b8,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_230);
LAB_0017cf2d:
    bVar5 = bVar17;
    if ((element_type *)local_230._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_230._0_8_ + 8))();
    }
  }
  goto LAB_0017ce6a;
}

Assistant:

expression_ptr parse_primary_expression() {
        // PrimaryExpression :
        //  this
        //  Identifier
        //  Literal
        //  ArrayLiteral
        //  ObjectLiteral
        //  ( Expression )
        if (auto id = accept(token_type::identifier)) {
            return make_expression<identifier_expression>(id.text());
        } else if (accept(token_type::this_)) {
            return make_expression<this_expression>();
        } else if (version_ >= version::es3 && accept(token_type::lbracket)) {
            // ArrayLiteral
            std::vector<expression_ptr> elements;
            bool last_was_assignment_expression = false;
            while (!accept(token_type::rbracket)) {
                if (accept(token_type::comma)) {
                    if (!last_was_assignment_expression) {
                        elements.push_back(nullptr);
                    }
                    last_was_assignment_expression = false;
                } else {
                    if (last_was_assignment_expression) {
                        EXPECT(token_type::comma);
                    }
                    elements.push_back(parse_assignment_expression());
                    last_was_assignment_expression = true;
                }
            }
            return make_expression<array_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && accept(token_type::lbrace)) {
            // ObjectLiteral
            property_name_and_value_list elements;
            while (!accept(token_type::rbrace)) {
                if (!elements.empty()) {
                    EXPECT(token_type::comma);
                    if (version_ >= version::es5 && accept(token_type::rbrace)) {
                        // Trailing comma allowed in ES5+
                        break;
                    }
                }
                elements.push_back(parse_property_name_and_value());
                if (version_ >= version::es5) {
                    const auto& new_item = elements.back();
                    const auto new_item_str = new_item.name_str();
                    auto e = elements.end() - 1;
                    auto it = std::find_if(elements.begin(), e, [&](const property_name_and_value& v) {
                        if (v.name_str() != new_item_str) {
                            // Item doesn't match
                            return false;
                        }
                        // Repeated definitions are not allowed for data properties in strict mode
                        if (new_item.type() == property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return strict_mode_;
                        }
                        // May not change a data property to an accessor property or vice versa
                        if (new_item.type() == property_assignment_type::normal && v.type() != property_assignment_type::normal) {
                            return true;
                        }
                        if (new_item.type() != property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return true;
                        }
                        // May only define getter/setter once
                        assert(new_item.type() == property_assignment_type::get || new_item.type() == property_assignment_type::set);
                        assert(v.type() == property_assignment_type::get || v.type() == property_assignment_type::set);
                        return new_item.type() == v.type();
                    });
                    if (it != e) {
                        SYNTAX_ERROR_AT("Invalid redefinition of property: \"" << cpp_quote(new_item_str) << "\"", elements.back().name().extend());
                    }
                }
            }
            return make_expression<object_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && (current_token_type() == token_type::divide || current_token_type() == token_type::divideequal)) {
            // RegularExpressionLiteral
            const auto lit = lexer_.get_regex_literal();
            check_token();
            skip_whitespace();
            assert(lit.size() >= 3);
            assert(lit[0] == '/');
            const auto lit_end = lit.find_last_of('/');
            assert(lit_end > 1 && lit_end != std::wstring_view::npos);
            return make_expression<regexp_literal_expression>(lit.substr(1, lit_end-1), lit.substr(lit_end+1));
        } else if (accept(token_type::lparen)) {
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return e;
        } else if (is_literal(current_token_type())) {
            check_literal();
            return make_expression<literal_expression>(get_token());
        }
        UNHANDLED();
    }